

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O3

long Vec3::random(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 (*in_RDI) [16];
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar11;
  double dStack_50;
  
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar3 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar9 = DAT_001050c0;
  dVar7 = random_double()::dist;
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar4 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar10 = DAT_001050c0;
  dVar8 = random_double()::dist;
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar5 = in_XMM1_Qa - (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  auVar1._8_4_ = SUB84(dVar8,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar6 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar11 = (DAT_001050c0 - random_double()::dist) * dVar6 + random_double()::dist;
  dVar6 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  dStack_50 = auVar1._8_8_;
  dVar4 = dVar6 + dVar5 * (dVar4 * (dVar10 - dVar8) + dStack_50);
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar6 + dVar5 * (dVar3 * (dVar9 - dVar7) + dVar7);
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *in_RDI = auVar2;
  *(double *)in_RDI[1] = dVar11 * dVar5 + dVar6;
  return (long)in_RDI;
}

Assistant:

inline static Vec3 random(double min, double max) {
            return Vec3(random_double(min,max),random_double(min,max), random_double(min,max));
        }